

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

void InvalidateBlock(ChainstateManager *chainman,uint256 block_hash)

{
  long lVar1;
  CBlockIndex *pindex;
  Chainstate *pCVar2;
  UniValue *pUVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  shared_ptr<const_CBlock> pblock;
  undefined1 local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_b0 [2];
  allocator<char> local_99;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock46;
  string local_88;
  BlockValidationState state;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  pcVar4 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp"
  ;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock46,&cs_main,"chainman.GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp"
             ,0x64a,false);
  pindex = node::BlockManager::LookupBlockIndex(&chainman->m_blockman,&block_hash);
  if (pindex == (CBlockIndex *)0x0) {
    pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Block not found",&local_99);
    JSONRPCError(pUVar3,-5,&local_88);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock46.super_unique_lock);
    pCVar2 = ChainstateManager::ActiveChainstate(chainman);
    Chainstate::InvalidateBlock(pCVar2,&state,pindex);
    if (state.super_ValidationState<BlockValidationResult>.m_mode == M_VALID) {
      pCVar2 = ChainstateManager::ActiveChainstate(chainman);
      local_b8._0_4_ = 0;
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar4;
      pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_b8;
      Chainstate::ActivateBestChain(pCVar2,&state,pblock);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_b0);
      if (state.super_ValidationState<BlockValidationResult>.m_mode == M_VALID) {
        ValidationState<BlockValidationResult>::~ValidationState
                  (&state.super_ValidationState<BlockValidationResult>);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
        goto LAB_00269ba9;
      }
    }
    pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              (&local_88,&state.super_ValidationState<BlockValidationResult>);
    JSONRPCError(pUVar3,-0x14,&local_88);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
LAB_00269ba9:
  __stack_chk_fail();
}

Assistant:

void InvalidateBlock(ChainstateManager& chainman, const uint256 block_hash) {
    BlockValidationState state;
    CBlockIndex* pblockindex;
    {
        LOCK(chainman.GetMutex());
        pblockindex = chainman.m_blockman.LookupBlockIndex(block_hash);
        if (!pblockindex) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }
    }
    chainman.ActiveChainstate().InvalidateBlock(state, pblockindex);

    if (state.IsValid()) {
        chainman.ActiveChainstate().ActivateBestChain(state);
    }

    if (!state.IsValid()) {
        throw JSONRPCError(RPC_DATABASE_ERROR, state.ToString());
    }
}